

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_channel_map_is_valid(ma_channel *pChannelMap,ma_uint32 channels)

{
  ma_channel mVar1;
  uint in_ESI;
  ma_uint32 iChannel;
  uint uVar2;
  ma_bool32 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    if (1 < in_ESI) {
      for (uVar2 = 0; uVar2 < in_ESI; uVar2 = uVar2 + 1) {
        mVar1 = ma_channel_map_get_channel((ma_channel *)CONCAT44(in_ESI,uVar2),0,0x1d9146);
        if (mVar1 == '\x01') {
          return 0;
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

MA_API ma_bool32 ma_channel_map_is_valid(const ma_channel* pChannelMap, ma_uint32 channels)
{
    /* A channel count of 0 is invalid. */
    if (channels == 0) {
        return MA_FALSE;
    }

    /* It does not make sense to have a mono channel when there is more than 1 channel. */
    if (channels > 1) {
        ma_uint32 iChannel;
        for (iChannel = 0; iChannel < channels; ++iChannel) {
            if (ma_channel_map_get_channel(pChannelMap, channels, iChannel) == MA_CHANNEL_MONO) {
                return MA_FALSE;
            }
        }
    }

    return MA_TRUE;
}